

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O3

int rnndec_varaddvalue(rnndeccontext *ctx,char *varset,uint64_t value)

{
  int iVar1;
  rnnenum *prVar2;
  rnndecvariant *prVar3;
  rnndecvariant **pprVar4;
  int iVar5;
  long lVar6;
  
  prVar2 = rnn_findenum(ctx->db,varset);
  if (prVar2 == (rnnenum *)0x0) {
    fprintf(_stderr,"Enum %s doesn\'t exist in database!\n",varset);
  }
  else {
    if (0 < (long)prVar2->valsnum) {
      lVar6 = 0;
      do {
        if ((prVar2->vals[lVar6]->valvalid != 0) && (prVar2->vals[lVar6]->value == value)) {
          prVar3 = (rnndecvariant *)calloc(0x10,1);
          prVar3->en = prVar2;
          prVar3->variant = (int)lVar6;
          iVar5 = ctx->varsnum;
          iVar1 = ctx->varsmax;
          if (iVar5 < iVar1) {
            pprVar4 = ctx->vars;
          }
          else {
            iVar5 = 0x10;
            if (iVar1 != 0) {
              iVar5 = iVar1 * 2;
            }
            ctx->varsmax = iVar5;
            pprVar4 = (rnndecvariant **)realloc(ctx->vars,(long)iVar5 << 3);
            ctx->vars = pprVar4;
            iVar5 = ctx->varsnum;
          }
          ctx->varsnum = iVar5 + 1;
          pprVar4[iVar5] = prVar3;
          return 1;
        }
        lVar6 = lVar6 + 1;
      } while (prVar2->valsnum != lVar6);
    }
    fprintf(_stderr,"Value %lx doesn\'t exist in enum %s!\n",value,varset);
  }
  return 0;
}

Assistant:

int rnndec_varaddvalue(struct rnndeccontext *ctx, char *varset, uint64_t value)
{
	struct rnnenum *en = rnn_findenum(ctx->db, varset);
	if (!en) {
		fprintf (stderr, "Enum %s doesn't exist in database!\n", varset);
		return 0;
	}
	int i;
	for (i = 0; i < en->valsnum; i++)
		if (en->vals[i]->valvalid && en->vals[i]->value == value) {
			struct rnndecvariant *ci = calloc (sizeof *ci, 1);
			ci->en = en;
			ci->variant = i;
			ADDARRAY(ctx->vars, ci);
			return 1;
		}

	fprintf (stderr, "Value %"PRIx64" doesn't exist in enum %s!\n", value, varset);
	return 0;
}